

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgm1394.cpp
# Opt level: O2

bool PromProgramTest(AmpIO *Board)

{
  bool bVar1;
  int iVar2;
  long lVar3;
  ostream *poVar4;
  uchar testBuffer [256];
  uchar readBuffer [256];
  uint8_t local_228 [520];
  
  for (lVar3 = 0; lVar3 != 0x100; lVar3 = lVar3 + 1) {
    local_228[lVar3] = (uint8_t)lVar3;
  }
  poVar4 = std::operator<<((ostream *)&std::cout,"Testing PROM programming");
  std::endl<char,std::char_traits<char>>(poVar4);
  std::operator<<((ostream *)&std::cout,"  Erasing sector 1E0000 ");
  std::ostream::flush();
  FpgaIO::PromSectorErase(&Board->super_FpgaIO,0x1e0000,PromProgramCallback);
  poVar4 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  std::operator<<(poVar4,"  Programming first page ");
  std::ostream::flush();
  iVar2 = FpgaIO::PromProgramPage(&Board->super_FpgaIO,0x1eff00,local_228,0x100,PromProgramCallback)
  ;
  if (iVar2 == 0x100) {
    Amp1394_Sleep(0.005);
    poVar4 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    poVar4 = std::operator<<(poVar4,"  Reading first page ");
    std::endl<char,std::char_traits<char>>(poVar4);
    bVar1 = FpgaIO::PromReadData(&Board->super_FpgaIO,0x1eff00,local_228 + 0x100,0x100);
    if (bVar1) {
      for (lVar3 = 0; lVar3 != 0x100; lVar3 = lVar3 + 1) {
        if (local_228[lVar3] != local_228[lVar3 + 0x100]) {
          poVar4 = std::operator<<((ostream *)&std::cout,"  Mismatch at offset ");
          poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
          poVar4 = std::operator<<(poVar4,": wrote ");
          poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
          poVar4 = std::operator<<(poVar4,", read ");
          poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
          goto LAB_00105fe8;
        }
      }
      poVar4 = std::operator<<((ostream *)&std::cout,"PROM programming test successful");
      bVar1 = true;
      goto LAB_00105fea;
    }
    poVar4 = std::operator<<((ostream *)&std::cerr,"  Error reading PROM data");
  }
  else {
    poVar4 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    poVar4 = std::operator<<(poVar4,"  Cannot program test pattern, ret = ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar2);
  }
LAB_00105fe8:
  bVar1 = false;
LAB_00105fea:
  std::endl<char,std::char_traits<char>>(poVar4);
  return bVar1;
}

Assistant:

bool PromProgramTest(AmpIO &Board)
{
    unsigned char testBuffer[256];
    unsigned char readBuffer[256];
    size_t i;
    for (i = 0; i < sizeof(testBuffer); i++)
        testBuffer[i] = static_cast<unsigned char>(i);

    std::cout << "Testing PROM programming" << std::endl;
    std::cout << "  Erasing sector 1E0000 " << std::flush;
    Board.PromSectorErase(0x1E0000, PromProgramCallback);
    std::cout << std::endl << "  Programming first page " << std::flush;
    int ret = Board.PromProgramPage(0x1EFF00, (uint8_t*)testBuffer, sizeof(testBuffer), PromProgramCallback);
    if (ret != sizeof(testBuffer)) {
        std::cout << std::endl << "  Cannot program test pattern, ret = " << ret << std::endl;
        return false;
    }
    Amp1394_Sleep(0.005);
    std::cout << std::endl << "  Reading first page " << std::endl;
    if (!Board.PromReadData(0x1EFF00, readBuffer, sizeof(readBuffer))) {
        std::cerr << "  Error reading PROM data" << std::endl;
        return false;
    }
    // Compare bytes
    for (i = 0; i < sizeof(testBuffer); i++) {
        if (testBuffer[i] != readBuffer[i]) {
            std::cout << "  Mismatch at offset " << i << ": wrote " << static_cast<unsigned int>(testBuffer[i])
                      << ", read " << static_cast<unsigned int>(readBuffer[i]) << std::endl;
            return false;
        }
    }
    std::cout << "PROM programming test successful" << std::endl;
    return true;
}